

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datamodel.cpp
# Opt level: O1

size_t __thiscall FSSDataModel::addDataSource(FSSDataModel *this,DataSourceType type,QString *path)

{
  int iVar1;
  DataSourceAmiga *this_00;
  size_t sVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_01;
  DataSourceAmiga *pDVar3;
  undefined1 local_79;
  DataSourceAmiga *local_78;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_70 [2];
  QArrayData *local_60;
  char *local_58;
  AllocationOption local_50;
  char *local_48;
  PSource local_40;
  PSource local_30;
  
  if (type == DataSourceTypeCustom) {
    QString::toLocal8Bit_helper((QChar *)&local_60,(longlong)(path->d).ptr);
    if ((local_60 == (QArrayData *)0x0) ||
       (1 < (local_60->ref_)._q_value.super___atomic_base<int>._M_i)) {
      QByteArray::reallocData((longlong)&local_60,local_50);
    }
    local_48 = local_58;
    local_78 = (DataSourceAmiga *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<DataSourceCustom,std::allocator<DataSourceCustom>,char*>
              (a_Stack_70,(DataSourceCustom **)&local_78,(allocator<DataSourceCustom> *)&local_79,
               &local_48);
  }
  else if (type == DataSourceTypeAmiga) {
    QString::toLocal8Bit_helper((QChar *)&local_60,(longlong)(path->d).ptr);
    if ((local_60 == (QArrayData *)0x0) ||
       (1 < (local_60->ref_)._q_value.super___atomic_base<int>._M_i)) {
      QByteArray::reallocData((longlong)&local_60,local_50);
    }
    local_48 = local_58;
    local_78 = (DataSourceAmiga *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<DataSourceAmiga,std::allocator<DataSourceAmiga>,char*>
              (a_Stack_70,&local_78,(allocator<DataSourceAmiga> *)&local_79,&local_48);
  }
  else {
    if (type != DataSourceTypeDos) {
      pDVar3 = (DataSourceAmiga *)0x0;
      this_01._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      goto LAB_0011e222;
    }
    QString::toLocal8Bit_helper((QChar *)&local_60,(longlong)(path->d).ptr);
    if ((local_60 == (QArrayData *)0x0) ||
       (1 < (local_60->ref_)._q_value.super___atomic_base<int>._M_i)) {
      QByteArray::reallocData((longlong)&local_60,local_50);
    }
    local_48 = local_58;
    local_78 = (DataSourceAmiga *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<DataSourceDOS,std::allocator<DataSourceDOS>,char*>
              (a_Stack_70,(DataSourceDOS **)&local_78,(allocator<DataSourceDOS> *)&local_79,
               &local_48);
  }
  this_01._M_pi = a_Stack_70[0]._M_pi;
  pDVar3 = local_78;
  a_Stack_70[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_78 = (DataSourceAmiga *)0x0;
  if (local_60 != (QArrayData *)0x0) {
    LOCK();
    (local_60->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_60->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_60->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_60,1,8);
    }
  }
LAB_0011e222:
  sVar2 = 0xffffffffffffffff;
  if ((pDVar3 != (DataSourceAmiga *)0x0) &&
     (this_00 = pDVar3,
     iVar1 = (*(pDVar3->super_DataSourceLegacy).super_DataSourceBase.super_Source._vptr_Source[6])()
     , (char)iVar1 != '\0')) {
    if (this_01._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (this_01._M_pi)->_M_use_count = (this_01._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (this_01._M_pi)->_M_use_count = (this_01._M_pi)->_M_use_count + 1;
      }
    }
    local_30.super___shared_ptr<Data::Source,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)pDVar3;
    local_30.super___shared_ptr<Data::Source,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         this_01._M_pi;
    saveSetting((FSSDataModel *)this_00,&local_30);
    if (local_30.super___shared_ptr<Data::Source,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_30.super___shared_ptr<Data::Source,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (this_01._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (this_01._M_pi)->_M_use_count = (this_01._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (this_01._M_pi)->_M_use_count = (this_01._M_pi)->_M_use_count + 1;
      }
    }
    local_40.super___shared_ptr<Data::Source,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)pDVar3;
    local_40.super___shared_ptr<Data::Source,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         this_01._M_pi;
    sVar2 = addDataSource(this,&local_40);
    if (local_40.super___shared_ptr<Data::Source,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_40.super___shared_ptr<Data::Source,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
  }
  if (this_01._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01._M_pi);
  }
  return sVar2;
}

Assistant:

size_t
FSSDataModel::addDataSource(DataSourceType type, const QString &path) {
  Data::PSource source;

  switch (type) {
    case DataSourceTypeDos:
      source = std::make_shared<DataSourceDOS>(path.toLocal8Bit().data());
      break;
    case DataSourceTypeAmiga:
      source = std::make_shared<DataSourceAmiga>(path.toLocal8Bit().data());
      break;
    case DataSourceTypeCustom:
      source = std::make_shared<DataSourceCustom>(path.toLocal8Bit().data());
      break;
  }

  if (source && source->load()) {
    saveSetting(source);
    return addDataSource(source);
  }

  return std::numeric_limits<size_t>::max();
}